

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

Availability __thiscall
anon_unknown.dwarf_6f47f7::Satisfier::Sign
          (Satisfier *this,CPubKey *key,vector<unsigned_char,_std::allocator<unsigned_char>_> *sig)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  pointer pTVar4;
  pair<(anonymous_namespace)::ChallengeType,_unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000008;
  const_iterator it_1;
  const_iterator it;
  MiniscriptContext in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  key_type *in_stack_ffffffffffffff70;
  map<XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *pubkey;
  Availability local_5c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ChallengeNumber((CPubKey *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>::
  pair<(anonymous_namespace)::ChallengeType,_unsigned_int,_true>
            (in_RDI,&in_stack_ffffffffffffff70->first,
             (uint *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  sVar3 = std::
          set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
          ::count((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                   *)in_RDI,in_stack_ffffffffffffff70);
  if (sVar3 == 0) {
    local_5c = NO;
  }
  else {
    bVar2 = miniscript::IsTapscript(in_stack_ffffffffffffff68);
    if (bVar2) {
      pTVar4 = std::
               unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
               ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                             *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      pubkey = &pTVar4->schnorr_signatures;
      XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_RDI,(CPubKey *)pubkey);
      std::
      map<XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::find(pubkey,(key_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::
      unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
      ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                    *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::
      map<XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end(pubkey);
      bVar2 = std::operator==((_Self *)in_RDI,(_Self *)pubkey);
      if (bVar2) {
        local_5c = NO;
        goto LAB_007ab61e;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (in_stack_00000008,unaff_retaddr);
    }
    else {
      std::
      unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
      ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                    *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::
      map<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::find((map<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)in_stack_ffffffffffffff70,
             (key_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::
      unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
      ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                    *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::
      map<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((map<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)in_stack_ffffffffffffff70);
      bVar2 = std::operator==((_Self *)in_RDI,(_Self *)in_stack_ffffffffffffff70);
      if (bVar2) {
        local_5c = NO;
        goto LAB_007ab61e;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (in_stack_00000008,unaff_retaddr);
    }
    local_5c = YES;
  }
LAB_007ab61e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_5c;
  }
  __stack_chk_fail();
}

Assistant:

miniscript::Availability Sign(const CPubKey& key, std::vector<unsigned char>& sig) const {
        if (supported.count(Challenge(ChallengeType::PK, ChallengeNumber(key)))) {
            if (!miniscript::IsTapscript(m_script_ctx)) {
                auto it = g_testdata->signatures.find(key);
                if (it == g_testdata->signatures.end()) return miniscript::Availability::NO;
                sig = it->second;
            } else {
                auto it = g_testdata->schnorr_signatures.find(XOnlyPubKey{key});
                if (it == g_testdata->schnorr_signatures.end()) return miniscript::Availability::NO;
                sig = it->second;
            }
            return miniscript::Availability::YES;
        }
        return miniscript::Availability::NO;
    }